

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

int fmt::v7::detail::format_float<double>
              (double value,int precision,float_specs specs,buffer<char> *buf)

{
  size_t sVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int iVar10;
  uint uVar11;
  int iVar12;
  result rVar13;
  ulong uVar14;
  ulong uVar15;
  byte bVar16;
  uint uVar17;
  ulong uVar18;
  uint64_t uVar19;
  long lVar20;
  size_t __len;
  char cVar21;
  ulong uVar22;
  long lVar23;
  uint64_t error;
  ulong uVar24;
  bool bVar25;
  boundaries bVar26;
  fp local_88;
  double local_78;
  undefined1 local_70 [8];
  fixed_handler handler;
  int local_48;
  uint local_34 [2];
  int exp;
  
  if (value < 0.0) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/extern/fmt/include/fmt/format-inl.h"
                ,0x435,"value is negative");
  }
  uVar24 = (ulong)specs & 0xff00000000;
  if (value <= 0.0) {
    if (precision < 1 || uVar24 != 0x200000000) {
      if (buf->capacity_ < buf->size_ + 1) {
        (**buf->_vptr_buffer)(buf);
      }
      sVar1 = buf->size_;
      buf->size_ = sVar1 + 1;
      buf->ptr_[sVar1] = '0';
      iVar12 = 0;
    }
    else {
      uVar24 = (ulong)(uint)precision;
      if (buf->capacity_ < uVar24) {
        (**buf->_vptr_buffer)(buf,uVar24);
      }
      uVar14 = buf->capacity_;
      if (uVar24 <= buf->capacity_) {
        uVar14 = uVar24;
      }
      buf->size_ = uVar14;
      memset(buf->ptr_,0x30,uVar24);
      iVar12 = -precision;
    }
  }
  else {
    if ((specs._4_4_ >> 0x13 & 1) == 0) {
      iVar12 = snprintf_float<double>(value,precision,specs,buf);
      return iVar12;
    }
    local_34[0] = 0;
    if (precision < 0) {
      local_88.f = 0;
      local_88.e = 0;
      if ((specs._4_4_ >> 0x12 & 1) == 0) {
        local_78 = value;
        bVar26 = fp::assign_with_boundaries<double>(&local_88,value);
      }
      else {
        local_78 = value;
        bVar26 = fp::assign_float_with_boundaries<double>(&local_88,value);
      }
      if ((local_88.f >> 0x34 & 1) == 0) {
        lVar20 = 0x3f;
        if ((local_88.f & 0xfffffffffffff) != 0) {
          for (; (local_88.f & 0xfffffffffffff) >> lVar20 == 0; lVar20 = lVar20 + -1) {
          }
        }
        local_88.f = local_88.f << (~(byte)lVar20 + 0x35 & 0x3f);
        local_88.e = (local_88.e - ((uint)lVar20 ^ 0x3f)) + 0xb;
      }
      iVar12 = (int)((ulong)((long)(-0x32 - local_88.e) * 0x4d104d42 + 0xffffffff) >> 0x20);
      uVar17 = iVar12 + 0x15b;
      uVar11 = iVar12 + 0x162;
      if (-1 < (int)uVar17) {
        uVar11 = uVar17;
      }
      uVar24 = *(ulong *)(basic_data<void>::pow10_significands + (long)((int)uVar11 >> 3) * 8 + 8);
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uVar24;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = local_88.f << 0xb;
      local_88.f = SUB168(auVar3 * auVar7,8) - (SUB168(auVar3 * auVar7,0) >> 0x3f);
      iVar12 = local_88.e +
               *(short *)(basic_data<void>::pow10_exponents + (long)((int)uVar11 >> 3) * 2 + 2) +
               0x35;
      if (0x1c < local_88.e +
                 *(short *)(basic_data<void>::pow10_exponents + (long)((int)uVar11 >> 3) * 2 + 2) +
                 0x71U) {
        local_88.e = iVar12;
        __assert_fail("min_exp <= fp_value.e && fp_value.e <= -32",
                      "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/extern/fmt/include/fmt/format-inl.h"
                      ,0x455,
                      "int fmt::detail::format_float(T, int, float_specs, buffer<char> &) [T = double]"
                     );
      }
      auVar4._8_8_ = 0;
      auVar4._0_8_ = uVar24;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = bVar26.upper;
      lVar20 = SUB168(auVar4 * auVar8,8);
      lVar23 = -(SUB168(auVar4 * auVar8,0) >> 0x3f);
      uVar18 = lVar20 + lVar23 + 1;
      local_70 = (undefined1  [8])buf->ptr_;
      handler._8_8_ = uVar18 - local_88.f;
      bVar16 = -(char)iVar12;
      handler._16_8_ = 1L << (bVar16 & 0x3f);
      uVar14 = uVar18 >> (bVar16 & 0x3f);
      auVar5._8_8_ = 0;
      auVar5._0_8_ = uVar24;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = bVar26.lower;
      handler.buf._0_4_ = 0;
      uVar17 = (uint)uVar14;
      local_88.e = iVar12;
      if (uVar17 == 0) goto LAB_0023884d;
      if (uVar14 >> 0x20 != 0) goto LAB_00238865;
      uVar24 = handler._16_8_ - 1;
      local_34[0] = 1;
      if (((((9 < uVar17) && (local_34[0] = 2, 99 < uVar17)) && (local_34[0] = 3, 999 < uVar17)) &&
          ((local_34[0] = 4, 9999 < uVar17 && (local_34[0] = 5, 99999 < uVar17)))) &&
         ((local_34[0] = 6, 999999 < uVar17 &&
          ((local_34[0] = 7, 9999999 < uVar17 && (local_34[0] = 8, 99999999 < uVar17)))))) {
        local_34[0] = 10 - (uVar17 < 1000000000);
      }
      local_48 = (uVar11 & 0xfffffff8) + 8;
      uVar19 = ((SUB168(auVar5 * auVar9,0) >> 0x3f) - SUB168(auVar5 * auVar9,8)) + lVar20 + lVar23 +
               2;
      uVar18 = uVar18 & uVar24;
      do {
        lVar20 = (long)(int)local_34[0];
        switch(local_34[0]) {
        case 1:
          cVar21 = (char)uVar14;
          uVar14 = 0;
          goto LAB_00238667;
        case 2:
          cVar21 = (char)((uVar14 & 0xffffffff) / 10);
          iVar12 = (int)((uVar14 & 0xffffffff) / 10) * 10;
          break;
        case 3:
          cVar21 = (char)((uVar14 & 0xffffffff) / 100);
          iVar12 = (int)((uVar14 & 0xffffffff) / 100) * 100;
          break;
        case 4:
          cVar21 = (char)((uVar14 & 0xffffffff) / 1000);
          iVar12 = (int)((uVar14 & 0xffffffff) / 1000) * 1000;
          break;
        case 5:
          cVar21 = (char)((uVar14 & 0xffffffff) / 10000);
          iVar12 = (int)((uVar14 & 0xffffffff) / 10000) * 10000;
          break;
        case 6:
          uVar15 = uVar14 >> 5 & 0x7ffffff;
          cVar21 = (char)(uVar15 / 0xc35);
          iVar12 = (int)(uVar15 / 0xc35) * 100000;
          break;
        case 7:
          cVar21 = (char)((uVar14 & 0xffffffff) / 1000000);
          iVar12 = (int)((uVar14 & 0xffffffff) / 1000000) * 1000000;
          break;
        case 8:
          cVar21 = (char)((uVar14 & 0xffffffff) / 10000000);
          iVar12 = (int)((uVar14 & 0xffffffff) / 10000000) * 10000000;
          break;
        case 9:
          cVar21 = (char)((uVar14 & 0xffffffff) / 100000000);
          iVar12 = (int)((uVar14 & 0xffffffff) / 100000000) * 100000000;
          break;
        case 10:
          uVar15 = (uVar14 >> 9 & 0x7fffff) * 0x44b83;
          cVar21 = (char)(uVar15 >> 0x27);
          iVar12 = (uint)(uVar15 >> 0x27) * 1000000000;
          break;
        default:
          goto switchD_002381d5_default;
        }
        uVar14 = (ulong)(uint)((int)uVar14 - iVar12);
LAB_00238667:
        local_34[0] = local_34[0] - 1;
        rVar13 = grisu_shortest_handler::on_digit
                           ((grisu_shortest_handler *)local_70,cVar21 + '0',
                            *(long *)(basic_data<void>::bsr2log10 + lVar20 * 8 + 0x78) <<
                            (bVar16 & 0x3f),(uVar14 << (bVar16 & 0x3f)) + uVar18,uVar19,local_34[0],
                            true);
        if (rVar13 != more) goto LAB_0023870d;
      } while (0 < (int)local_34[0]);
      do {
        uVar14 = uVar18 * 10;
        uVar19 = uVar19 * 10;
        uVar18 = uVar14 & uVar24;
        local_34[0] = local_34[0] - 1;
        rVar13 = grisu_shortest_handler::on_digit
                           ((grisu_shortest_handler *)local_70,
                            (char)(uVar14 >> (bVar16 & 0x3f)) + '0',handler._16_8_,uVar18,uVar19,
                            local_34[0],false);
      } while (rVar13 == more);
LAB_0023870d:
      uVar24 = (ulong)(uint)handler.buf;
      if (rVar13 == error) {
        local_34[0] = local_34[0] + ((uint)handler.buf - local_48) + 0x15b;
        fallback_format<double>(local_78,buf,(int *)local_34);
        buf = (buffer<char> *)(ulong)local_34[0];
      }
      else {
        if ((int)(uint)handler.buf < 0) goto LAB_0023889c;
        if (buf->capacity_ < uVar24) {
          (**buf->_vptr_buffer)(buf,uVar24);
        }
        if (buf->capacity_ < uVar24) {
          uVar24 = buf->capacity_;
        }
        buf->size_ = uVar24;
      }
      if (rVar13 == error) {
        return (int)buf;
      }
    }
    else {
      if (0x11 < precision) {
        iVar12 = snprintf_float<double>(value,precision,specs,buf);
        return iVar12;
      }
      uVar18 = (ulong)value & 0xfffffffffffff;
      bVar25 = (ulong)value >> 0x34 == 0;
      uVar14 = uVar18 | 0x10000000000000;
      if (bVar25) {
        uVar14 = uVar18;
      }
      iVar12 = (uint)((ulong)value >> 0x34) - 0x433;
      if (bVar25) {
        lVar20 = 0x3f;
        if (uVar18 != 0) {
          for (; uVar18 >> lVar20 == 0; lVar20 = lVar20 + -1) {
          }
        }
        uVar14 = uVar14 << (~(byte)lVar20 + 0x35 & 0x3f);
        iVar12 = -0x427 - ((uint)lVar20 ^ 0x3f);
      }
      iVar10 = (int)((ulong)((long)(-0x32 - iVar12) * 0x4d104d42 + 0xffffffff) >> 0x20);
      uVar17 = iVar10 + 0x15b;
      uVar11 = iVar10 + 0x162;
      if (-1 < (int)uVar17) {
        uVar11 = uVar17;
      }
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar14 << 0xb;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = *(ulong *)(basic_data<void>::pow10_significands +
                               (long)((int)uVar11 >> 3) * 8 + 8);
      uVar14 = SUB168(auVar2 * auVar6,8) - (SUB168(auVar2 * auVar6,0) >> 0x3f);
      uVar17 = -(*(short *)(basic_data<void>::pow10_exponents + (long)((int)uVar11 >> 3) * 2 + 2) +
                iVar12) - 0x35;
      handler._16_8_ = ZEXT48(uVar17);
      local_70 = (undefined1  [8])buf->ptr_;
      handler.buf._0_4_ = 0;
      bVar16 = (byte)uVar17;
      uVar19 = 1L << (bVar16 & 0x3f);
      handler.precision._0_1_ = uVar24 == 0x200000000;
      handler.size = 0x154 - (uVar11 & 0xfffffff8);
      uVar18 = uVar14 >> (bVar16 & 0x3f);
      uVar17 = (uint)uVar18;
      handler.buf._4_4_ = precision;
      if (uVar17 == 0) {
LAB_0023884d:
        handler.buf._0_4_ = 0;
        assert_fail("/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/extern/fmt/include/fmt/format-inl.h"
                    ,0x334,"");
      }
      if (uVar18 >> 0x20 != 0) {
LAB_00238865:
        handler.buf._0_4_ = 0;
        assert_fail("/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/extern/fmt/include/fmt/format-inl.h"
                    ,0x335,"");
      }
      local_34[0] = 1;
      if ((((9 < uVar17) && (local_34[0] = 2, 99 < uVar17)) && (local_34[0] = 3, 999 < uVar17)) &&
         (((local_34[0] = 4, 9999 < uVar17 && (local_34[0] = 5, 99999 < uVar17)) &&
          ((local_34[0] = 6, 999999 < uVar17 &&
           ((local_34[0] = 7, 9999999 < uVar17 && (local_34[0] = 8, 99999999 < uVar17)))))))) {
        local_34[0] = 10 - (uVar17 < 1000000000);
      }
      local_78 = value;
      rVar13 = fixed_handler::on_start
                         ((fixed_handler *)local_70,
                          (&basic_data<void>::powers_of_10_64)[local_34[0] - 1] << (bVar16 & 0x3f),
                          uVar14 / 10,10,(int *)local_34);
      if (rVar13 == more) {
        uVar15 = uVar19 - 1;
        uVar14 = uVar14 & uVar15;
        do {
          lVar20 = (long)(int)local_34[0];
          switch(local_34[0]) {
          case 1:
            cVar21 = (char)uVar18;
            uVar18 = 0;
            goto LAB_002382b9;
          case 2:
            cVar21 = (char)((uVar18 & 0xffffffff) / 10);
            iVar12 = (int)((uVar18 & 0xffffffff) / 10) * 10;
            break;
          case 3:
            cVar21 = (char)((uVar18 & 0xffffffff) / 100);
            iVar12 = (int)((uVar18 & 0xffffffff) / 100) * 100;
            break;
          case 4:
            cVar21 = (char)((uVar18 & 0xffffffff) / 1000);
            iVar12 = (int)((uVar18 & 0xffffffff) / 1000) * 1000;
            break;
          case 5:
            cVar21 = (char)((uVar18 & 0xffffffff) / 10000);
            iVar12 = (int)((uVar18 & 0xffffffff) / 10000) * 10000;
            break;
          case 6:
            uVar22 = uVar18 >> 5 & 0x7ffffff;
            cVar21 = (char)(uVar22 / 0xc35);
            iVar12 = (int)(uVar22 / 0xc35) * 100000;
            break;
          case 7:
            cVar21 = (char)((uVar18 & 0xffffffff) / 1000000);
            iVar12 = (int)((uVar18 & 0xffffffff) / 1000000) * 1000000;
            break;
          case 8:
            cVar21 = (char)((uVar18 & 0xffffffff) / 10000000);
            iVar12 = (int)((uVar18 & 0xffffffff) / 10000000) * 10000000;
            break;
          case 9:
            cVar21 = (char)((uVar18 & 0xffffffff) / 100000000);
            iVar12 = (int)((uVar18 & 0xffffffff) / 100000000) * 100000000;
            break;
          case 10:
            uVar22 = (uVar18 >> 9 & 0x7fffff) * 0x44b83;
            cVar21 = (char)(uVar22 >> 0x27);
            iVar12 = (uint)(uVar22 >> 0x27) * 1000000000;
            break;
          default:
switchD_002381d5_default:
            assert_fail("/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/extern/fmt/include/fmt/format-inl.h"
                        ,0x367,"invalid number of digits");
          }
          uVar18 = (ulong)(uint)((int)uVar18 - iVar12);
LAB_002382b9:
          local_34[0] = local_34[0] - 1;
          rVar13 = fixed_handler::on_digit
                             ((fixed_handler *)local_70,cVar21 + '0',
                              *(long *)(basic_data<void>::bsr2log10 + lVar20 * 8 + 0x78) <<
                              ((byte)handler.exp10 & 0x3f),
                              (uVar18 << ((byte)handler.exp10 & 0x3f)) + uVar14,1,local_34[0],true);
          if (rVar13 != more) goto LAB_00238366;
        } while (0 < (int)local_34[0]);
        error = 1;
        do {
          uVar18 = uVar14 * 10;
          error = error * 10;
          uVar14 = uVar18 & uVar15;
          local_34[0] = local_34[0] - 1;
          rVar13 = fixed_handler::on_digit
                             ((fixed_handler *)local_70,
                              (char)(uVar18 >> ((byte)handler.exp10 & 0x3f)) + '0',uVar19,uVar14,
                              error,local_34[0],false);
        } while (rVar13 == more);
      }
LAB_00238366:
      if (rVar13 == error) {
        uVar17 = snprintf_float<double>(local_78,precision,specs,buf);
        uVar14 = (ulong)uVar17;
      }
      else {
        uVar14 = (ulong)(uint)handler.buf;
        if (0 < (int)(uint)handler.buf && uVar24 != 0x200000000) {
          uVar14 = (ulong)(uint)handler.buf;
          do {
            uVar17 = local_34[0] + 1;
            if (buf->ptr_[uVar14 - 1] != '0') goto LAB_002387c1;
            bVar25 = 1 < (long)uVar14;
            uVar14 = uVar14 - 1;
            local_34[0] = uVar17;
          } while (bVar25);
          uVar14 = 0;
        }
LAB_002387c1:
        if ((int)uVar14 < 0) {
LAB_0023889c:
          assert_fail("/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/extern/fmt/include/fmt/core.h"
                      ,0x13c,"negative value");
        }
        uVar14 = uVar14 & 0xffffffff;
        if (buf->capacity_ < uVar14) {
          (**buf->_vptr_buffer)(buf,uVar14);
        }
        if (buf->capacity_ < uVar14) {
          uVar14 = buf->capacity_;
        }
        buf->size_ = uVar14;
      }
      if (rVar13 == error) {
        return (int)uVar14;
      }
      local_48 = (uVar11 & 0xfffffff8) + 8;
    }
    iVar12 = (local_34[0] - local_48) + 0x15c;
  }
  return iVar12;
}

Assistant:

int format_float(T value, int precision, float_specs specs, buffer<char>& buf) {
  static_assert(!std::is_same<T, float>::value, "");
  FMT_ASSERT(value >= 0, "value is negative");

  const bool fixed = specs.format == float_format::fixed;
  if (value <= 0) {  // <= instead of == to silence a warning.
    if (precision <= 0 || !fixed) {
      buf.push_back('0');
      return 0;
    }
    buf.try_resize(to_unsigned(precision));
    std::uninitialized_fill_n(buf.data(), precision, '0');
    return -precision;
  }

  if (!specs.use_grisu) return snprintf_float(value, precision, specs, buf);

  int exp = 0;
  const int min_exp = -60;  // alpha in Grisu.
  int cached_exp10 = 0;     // K in Grisu.
  if (precision < 0) {
    fp fp_value;
    auto boundaries = specs.binary32
                          ? fp_value.assign_float_with_boundaries(value)
                          : fp_value.assign_with_boundaries(value);
    fp_value = normalize(fp_value);
    // Find a cached power of 10 such that multiplying value by it will bring
    // the exponent in the range [min_exp, -32].
    const fp cached_pow = get_cached_power(
        min_exp - (fp_value.e + fp::significand_size), cached_exp10);
    // Multiply value and boundaries by the cached power of 10.
    fp_value = fp_value * cached_pow;
    boundaries.lower = multiply(boundaries.lower, cached_pow.f);
    boundaries.upper = multiply(boundaries.upper, cached_pow.f);
    assert(min_exp <= fp_value.e && fp_value.e <= -32);
    --boundaries.lower;  // \tilde{M}^- - 1 ulp -> M^-_{\downarrow}.
    ++boundaries.upper;  // \tilde{M}^+ + 1 ulp -> M^+_{\uparrow}.
    // Numbers outside of (lower, upper) definitely do not round to value.
    grisu_shortest_handler handler{buf.data(), 0,
                                   boundaries.upper - fp_value.f};
    auto result =
        grisu_gen_digits(fp(boundaries.upper, fp_value.e),
                         boundaries.upper - boundaries.lower, exp, handler);
    if (result == digits::error) {
      exp += handler.size - cached_exp10 - 1;
      fallback_format(value, buf, exp);
      return exp;
    }
    buf.try_resize(to_unsigned(handler.size));
  } else {
    if (precision > 17) return snprintf_float(value, precision, specs, buf);
    fp normalized = normalize(fp(value));
    const auto cached_pow = get_cached_power(
        min_exp - (normalized.e + fp::significand_size), cached_exp10);
    normalized = normalized * cached_pow;
    fixed_handler handler{buf.data(), 0, precision, -cached_exp10, fixed};
    if (grisu_gen_digits(normalized, 1, exp, handler) == digits::error)
      return snprintf_float(value, precision, specs, buf);
    int num_digits = handler.size;
    if (!fixed) {
      // Remove trailing zeros.
      while (num_digits > 0 && buf[num_digits - 1] == '0') {
        --num_digits;
        ++exp;
      }
    }
    buf.try_resize(to_unsigned(num_digits));
  }
  return exp - cached_exp10;
}